

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O1

int Ifn_NtkParseInt_rec(char *pStr,Ifn_Ntk_t *p,char **ppFinal,int *piNode)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  undefined8 unaff_R13;
  ulong uVar8;
  int pFanins [11];
  byte *local_80;
  uint local_78;
  int local_74;
  char **local_70;
  int local_68 [14];
  
  bVar2 = *pStr;
  if (bVar2 < 0x5b) {
    if (bVar2 != 0x28) {
      if (bVar2 == 0x3c) {
        lVar7 = 5;
        uVar8 = CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
        goto LAB_00439540;
      }
LAB_00439527:
      uVar8 = 0;
      lVar7 = 0;
      goto LAB_00439540;
    }
    lVar7 = 3;
  }
  else if (bVar2 == 0x7b) {
    lVar7 = 6;
  }
  else {
    if (bVar2 != 0x5b) goto LAB_00439527;
    lVar7 = 4;
  }
  uVar8 = 0;
LAB_00439540:
  local_80 = (byte *)(pStr + 1);
  local_74 = (int)lVar7;
  pbVar1 = (byte *)Ifn_Symbs[lVar7];
  if (bVar2 != *pbVar1) {
    __assert_fail("*pStr == Open",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                  ,0xef,"char *Ifn_NtkParseFindClosingParenthesis(char *, char, char)");
  }
  if (bVar2 != 0) {
    iVar6 = 0;
    do {
      iVar6 = (iVar6 + (uint)(bVar2 == *pbVar1)) - (uint)(bVar2 == pbVar1[1]);
      if (iVar6 == 0) goto LAB_00439594;
      bVar2 = ((byte *)pStr)[1];
      pStr = (char *)((byte *)pStr + 1);
    } while (bVar2 != 0);
  }
  pStr = (char *)0x0;
LAB_00439594:
  *ppFinal = (char *)0x0;
  if ((byte *)pStr == (byte *)0x0) {
    iVar6 = 0;
    Ifn_ErrorMessage("For symbol \'%c\' cannot find matching symbol \'%c\'.\n",
                     (ulong)(uint)(int)(char)*pbVar1,(ulong)(uint)(int)(char)pbVar1[1]);
  }
  else {
    uVar5 = 0;
    if (local_80 < pStr) {
      local_78 = (uint)uVar8;
      uVar5 = 0;
      local_70 = ppFinal;
      do {
        if (uVar5 == 0xb) {
          __assert_fail("nFanins < IFN_INS",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                        ,0x106,"int Ifn_NtkParseInt_rec(char *, Ifn_Ntk_t *, char **, int *)");
        }
        bVar2 = *local_80;
        if ((byte)(bVar2 + 0x9f) < 0x1a) {
          local_68[uVar5] = (char)bVar2 + -0x61;
          local_80 = local_80 + 1;
        }
        else {
          uVar4 = bVar2 - 0x3c;
          if (((0x3f < uVar4) || ((0x8000000080000001U >> ((ulong)uVar4 & 0x3f) & 1) == 0)) &&
             (bVar2 != 0x28)) {
            Ifn_ErrorMessage("Substring \"%s\" contans unrecognized symbol \'%c\'.\n");
            return 0;
          }
          iVar6 = Ifn_NtkParseInt_rec((char *)local_80,p,(char **)&local_80,piNode);
          if (iVar6 == 0) {
            return 0;
          }
          local_68[uVar5] = *piNode + -1;
        }
        uVar5 = uVar5 + 1;
      } while (local_80 < pStr);
      uVar8 = (ulong)local_78;
      ppFinal = local_70;
    }
    if (local_80 != (byte *)pStr) {
      __assert_fail("pStr == pLim",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                    ,0x112,"int Ifn_NtkParseInt_rec(char *, Ifn_Ntk_t *, char **, int *)");
    }
    iVar6 = *piNode;
    *piNode = iVar6 + 1;
    uVar4 = *(uint *)(p->Nodes + iVar6);
    uVar3 = (uVar4 & 0xfffffff8) + local_74;
    *(uint *)(p->Nodes + iVar6) = uVar3;
    if ((uVar4 & 0xf8) != 0) {
      __assert_fail("pObj->nFanins == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                    ,0x115,"int Ifn_NtkParseInt_rec(char *, Ifn_Ntk_t *, char **, int *)");
    }
    *(uint *)(p->Nodes + iVar6) = uVar3 | (int)uVar5 * 8 & 0xffU;
    memcpy(p->Nodes[iVar6].Fanins,local_68,(uVar5 & 0xffffffff) << 2);
    *ppFinal = (char *)((byte *)pStr + 1);
    iVar6 = 1;
    if (((byte)uVar8 & (int)uVar5 != 3) == 1) {
      iVar6 = 0;
      Ifn_ErrorMessage("MUX should have exactly three fanins.\n");
    }
  }
  return iVar6;
}

Assistant:

int Ifn_NtkParseInt_rec( char * pStr, Ifn_Ntk_t * p, char ** ppFinal, int * piNode )
{
    Ifn_Obj_t * pObj;
    int nFanins = 0, pFanins[IFN_INS];
    int Type = Inf_ManOpenSymb( pStr );
    char * pLim = Ifn_NtkParseFindClosingParenthesis( pStr++, Ifn_Symbs[Type][0], Ifn_Symbs[Type][1] );
    *ppFinal = NULL;
    if ( pLim == NULL )
        return Ifn_ErrorMessage( "For symbol \'%c\' cannot find matching symbol \'%c\'.\n", Ifn_Symbs[Type][0], Ifn_Symbs[Type][1] );
    while ( pStr < pLim )
    {
        assert( nFanins < IFN_INS );
        if ( pStr[0] >= 'a' && pStr[0] <= 'z' )
            pFanins[nFanins++] = pStr[0] - 'a', pStr++; 
        else if ( Inf_ManOpenSymb(pStr) )
        {
            if ( !Ifn_NtkParseInt_rec( pStr, p, &pStr, piNode ) )
                return 0;
            pFanins[nFanins++] = *piNode - 1;
        }
        else
            return Ifn_ErrorMessage( "Substring \"%s\" contans unrecognized symbol \'%c\'.\n", pStr, pStr[0] );
    }
    assert( pStr == pLim );
    pObj = p->Nodes + (*piNode)++;
    pObj->Type = Type;
    assert( pObj->nFanins == 0 );
    pObj->nFanins = nFanins;
    memcpy( pObj->Fanins, pFanins, sizeof(int) * nFanins );
    *ppFinal = pLim + 1;
    if ( Type == IFN_DSD_MUX && nFanins != 3 )
        return Ifn_ErrorMessage( "MUX should have exactly three fanins.\n" );
    return 1;
}